

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

bool __thiscall rcg::Buffer::getDataLargerThanBuffer(Buffer *this)

{
  bool bVar1;
  void *stream;
  
  stream = Stream::getHandle(this->parent);
  bVar1 = anon_unknown_6::getBufferBool(&this->gentl,stream,this->buffer,0x1d);
  return bVar1;
}

Assistant:

bool Buffer::getDataLargerThanBuffer() const
{
  return getBufferBool(gentl, parent->getHandle(), buffer,
                       GenTL::BUFFER_INFO_DATA_LARGER_THAN_BUFFER);
}